

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

Vector3d * __thiscall VCCluster::center(VCCluster *this)

{
  double dVar1;
  Vector3d *in_RDI;
  undefined1 auVar2 [16];
  double dVar3;
  
  dVar1 = this->area;
  auVar2 = ZEXT816(0);
  dVar3 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar2 = divpd(*(undefined1 (*) [16])
                    (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array,auVar2);
    dVar3 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] / dVar1;
  }
  *(undefined1 (*) [16])
   (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
       auVar2;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       dVar3;
  return in_RDI;
}

Assistant:

Vector3d VCCluster::center() {
	if (area == 0)
		return Vector3d(0,0,0);
	return weightedSum / area;
}